

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O1

void concept_suite::input_iterator_equality_comparable(void)

{
  bool bVar1;
  initializer_list<int> __l;
  iterator a;
  iterator b;
  iterator c;
  vector<int,_std::allocator<int>_> data;
  circular_view<int,_18446744073709551615UL> span;
  iterator d;
  basic_iterator<int> local_90;
  iterator_type local_80;
  iterator_type local_70;
  vector<int,_std::allocator<int>_> local_60;
  circular_view<int,_18446744073709551615UL> local_48;
  iterator_type local_28;
  
  local_48.member.data = (pointer)0x160000000b;
  local_48.member.cap = 0x2c00000021;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_48;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,__l,(allocator_type *)&local_90);
  local_48.member.data =
       local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  if ((long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == 0) {
    local_48.member.data = (pointer)0x0;
  }
  local_48.member.cap =
       (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  local_90.current = 0;
  local_80.current = 0;
  local_70.current = 0;
  local_90.parent = &local_48;
  local_80.parent = &local_48;
  local_70.parent = &local_48;
  local_48.member.size = local_48.member.cap;
  local_48.member.next = local_48.member.cap;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_90,&local_90);
  boost::detail::test_impl
            ("a == a",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x5c,"void concept_suite::input_iterator_equality_comparable()",bVar1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_90,&local_80);
  boost::detail::test_impl
            ("a == b",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x5d,"void concept_suite::input_iterator_equality_comparable()",bVar1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_80,&local_90);
  boost::detail::test_impl
            ("b == a",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x5e,"void concept_suite::input_iterator_equality_comparable()",bVar1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_80,&local_70);
  boost::detail::test_impl
            ("b == c",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x5f,"void concept_suite::input_iterator_equality_comparable()",bVar1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_90,&local_70);
  boost::detail::test_impl
            ("a == c",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x60,"void concept_suite::input_iterator_equality_comparable()",bVar1);
  local_28.current = local_48.member.cap * 2;
  if ((local_28.current & local_48.member.cap * 2 - 1) == 0) {
    local_28.current = local_28.current - 1 & local_48.member.next;
  }
  else {
    local_28.current = local_48.member.next % local_28.current;
  }
  local_28.parent = &local_48;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_90,&local_28);
  boost::detail::test_impl
            ("a != d",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,99,"void concept_suite::input_iterator_equality_comparable()",!bVar1);
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void input_iterator_equality_comparable()
{
    std::vector<int> data = { 11, 22, 33, 44 };
    circular_view<int> span(data.begin(), data.end(), data.begin(), data.size());
    circular_view<int>::iterator a = span.begin();
    circular_view<int>::iterator b = span.begin();
    circular_view<int>::iterator c = span.begin();
    BOOST_TEST(a == a);
    BOOST_TEST(a == b);
    BOOST_TEST(b == a);
    BOOST_TEST(b == c);
    BOOST_TEST(a == c);

    circular_view<int>::iterator d = span.end();
    BOOST_TEST(a != d);
}